

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ntileValueFunc(sqlite3_context *pCtx)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  i64 iRow;
  i64 iSmall;
  i64 nLarge;
  int nSize;
  NtileCtx *p;
  sqlite3_context *pCtx_local;
  
  plVar3 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if ((plVar3 != (long *)0x0) && (0 < plVar3[1])) {
    iVar2 = (int)(*plVar3 / plVar3[1]);
    if (iVar2 == 0) {
      sqlite3_result_int64(pCtx,plVar3[2] + 1);
    }
    else {
      lVar4 = *plVar3 - plVar3[1] * (long)iVar2;
      lVar5 = lVar4 * (iVar2 + 1);
      lVar1 = plVar3[2];
      if (lVar1 < lVar5) {
        sqlite3_result_int64(pCtx,lVar1 / (long)(iVar2 + 1) + 1);
      }
      else {
        sqlite3_result_int64(pCtx,lVar4 + 1 + (lVar1 - lVar5) / (long)iVar2);
      }
    }
  }
  return;
}

Assistant:

static void ntileValueFunc(sqlite3_context *pCtx){
  struct NtileCtx *p;
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->nParam>0 ){
    int nSize = (p->nTotal / p->nParam);
    if( nSize==0 ){
      sqlite3_result_int64(pCtx, p->iRow+1);
    }else{
      i64 nLarge = p->nTotal - p->nParam*nSize;
      i64 iSmall = nLarge*(nSize+1);
      i64 iRow = p->iRow;

      assert( (nLarge*(nSize+1) + (p->nParam-nLarge)*nSize)==p->nTotal );

      if( iRow<iSmall ){
        sqlite3_result_int64(pCtx, 1 + iRow/(nSize+1));
      }else{
        sqlite3_result_int64(pCtx, 1 + nLarge + (iRow-iSmall)/nSize);
      }
    }
  }
}